

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLReader.cpp
# Opt level: O1

bool __thiscall xercesc_4_0::XMLReader::skippedString(XMLReader *this,XMLCh *toSkip)

{
  short *psVar1;
  XMLSize_t XVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar7 = 0;
  if (toSkip != (XMLCh *)0x0) {
    do {
      psVar1 = (short *)((long)toSkip + uVar7);
      uVar7 = uVar7 + 2;
    } while (*psVar1 != 0);
    uVar7 = ((long)uVar7 >> 1) - 1;
  }
  uVar6 = this->fCharsAvail - this->fCharIndex;
  do {
    if (uVar7 <= uVar6) {
      XVar2 = this->fCharIndex;
      iVar4 = bcmp(this->fCharBuf + XVar2,toSkip,uVar7 * 2);
      if (iVar4 != 0) {
        return false;
      }
      this->fCurCol = this->fCurCol + uVar7;
      this->fCharIndex = XVar2 + uVar7;
      return true;
    }
    bVar3 = refreshCharBuffer(this);
    if (!bVar3) {
      return false;
    }
    uVar5 = this->fCharsAvail - this->fCharIndex;
    bVar3 = uVar5 != uVar6;
    uVar6 = uVar5;
  } while (bVar3);
  return false;
}

Assistant:

bool XMLReader::skippedString(const XMLCh* const toSkip)
{
    // This function works on strings that are smaller than kCharBufSize.
    // This function guarantees that in case the comparison is unsuccessful
    // the fCharIndex will point to the original data.
    //

    // Get the length of the string to skip.
    //
    const XMLSize_t srcLen = XMLString::stringLen(toSkip);
    XMLSize_t charsLeft = charsLeftInBuffer();

    //  See if the current reader has enough chars to test against this
    //  string. If not, then ask it to reload its buffer. If that does not
    //  get us enough, then it cannot match.
    //
    //  NOTE: This works because strings never have to cross a reader! And
    //  a string to skip will never have a new line in it, so we will never
    //  miss adjusting the current line.
    //
    while (charsLeft < srcLen)
    {
      if (!refreshCharBuffer())
        return false;

      XMLSize_t tmp = charsLeftInBuffer();
      if (tmp == charsLeft) // if the refreshCharBuf() did not add anything new
        return false;     // give up and return.

      charsLeft = tmp;
    }

    //  Ok, now we now that the current reader has enough chars in its
    //  buffer and that its index is back at zero. So we can do a quick and
    //  dirty comparison straight to its buffer with no requirement to unget
    //  if it fails.
    //
    if (memcmp(&fCharBuf[fCharIndex], toSkip, srcLen * sizeof(XMLCh)))
      return false;

    // Add the source length to the current column to get it back right.
    //
    fCurCol += (XMLFileLoc)srcLen;

    //  And get the character buffer index back right by just adding the
    //  source len to it.
    //
    fCharIndex += srcLen;

    return true;
}